

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVRFile.cpp
# Opt level: O1

char * nextfield(char *p)

{
  if (p == (char *)0x0) {
    p = (char *)0x0;
  }
  else {
    while ((0xd < (byte)*p || ((0x2601U >> ((byte)*p & 0x1f) & 1) == 0))) {
      p = (char *)((byte *)p + 1);
    }
  }
  return (char *)((byte *)p + (*p == 9));
}

Assistant:

char *nextfield(char *p) {
	if (p) {
		while ((*p != '\t') && (*p != '\0') && (*p != '\r') && (*p != '\n')) {
			p++;
		}
	}
	if (*p == '\t') p++;
	return p;
}